

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::_InternalSerializeImpl
          (ExtensionSet *this,MessageLite *extendee,int start_field_number,int end_field_number,
          uint8_t *target,EpsCopyOutputStream *stream)

{
  KeyValue *pKVar1;
  uint8_t *puVar2;
  long lVar3;
  long lVar4;
  KeyValue *pKVar5;
  
  lVar3 = (long)(short)this->flat_size_;
  if (lVar3 < 0) {
    puVar2 = _InternalSerializeImplLarge
                       (this,extendee,start_field_number,end_field_number,target,stream);
    return puVar2;
  }
  pKVar1 = (this->map_).flat;
  lVar4 = lVar3 * 0x20;
  pKVar5 = pKVar1;
  if (this->flat_size_ == 0) {
LAB_00f49e82:
    for (; (pKVar5 != pKVar1 + lVar3 && (pKVar5->first < end_field_number)); pKVar5 = pKVar5 + 1) {
      target = Extension::InternalSerializeFieldWithCachedSizesToArray
                         (&pKVar5->second,extendee,this,pKVar5->first,target,stream);
    }
  }
  else {
    do {
      if (start_field_number <= pKVar5->first) goto LAB_00f49e82;
      lVar4 = lVar4 + -0x20;
      pKVar5 = pKVar5 + 1;
    } while (lVar4 != 0);
  }
  return target;
}

Assistant:

uint8_t* ExtensionSet::_InternalSerializeImpl(
    const MessageLite* extendee, int start_field_number, int end_field_number,
    uint8_t* target, io::EpsCopyOutputStream* stream) const {
  if (ABSL_PREDICT_FALSE(is_large())) {
    return _InternalSerializeImplLarge(extendee, start_field_number,
                                       end_field_number, target, stream);
  }
  const KeyValue* end = flat_end();
  const KeyValue* it = flat_begin();
  while (it != end && it->first < start_field_number) ++it;
  for (; it != end && it->first < end_field_number; ++it) {
    target = it->second.InternalSerializeFieldWithCachedSizesToArray(
        extendee, this, it->first, target, stream);
  }
  return target;
}